

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void rearrange_pix(RK_U8 *tmp_line,RK_U8 *base,RK_U32 n)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)(n * 10);
  uVar2 = (ulong)(n << 4);
  *(ushort *)(tmp_line + uVar2) = *(ushort *)(base + uVar1) & 0x3ff;
  *(ushort *)(tmp_line + uVar2 + 2) =
       (*(ushort *)(base + uVar1 + 2) & 0xf) << 6 | *(ushort *)(base + uVar1) >> 10;
  *(ushort *)(tmp_line + uVar2 + 4) = *(ushort *)(base + uVar1 + 2) >> 4 & 0x3ff;
  *(ushort *)(tmp_line + uVar2 + 6) =
       (*(ushort *)(base + uVar1 + 4) & 0xff) << 2 | *(ushort *)(base + uVar1 + 2) >> 0xe;
  *(ushort *)(tmp_line + uVar2 + 8) =
       (*(ushort *)(base + uVar1 + 6) & 3) << 8 | *(ushort *)(base + uVar1 + 4) >> 8;
  *(ushort *)(tmp_line + uVar2 + 10) = *(ushort *)(base + uVar1 + 6) >> 2 & 0x3ff;
  *(ushort *)(tmp_line + uVar2 + 0xc) =
       (*(ushort *)(base + uVar1 + 8) & 0x3f) << 4 | *(ushort *)(base + uVar1 + 6) >> 0xc;
  *(ushort *)(tmp_line + uVar2 + 0xe) = *(ushort *)(base + uVar1 + 8) >> 6;
  return;
}

Assistant:

static void rearrange_pix(RK_U8 *tmp_line, RK_U8 *base, RK_U32 n)
{
    RK_U16 * pix = (RK_U16 *)(tmp_line + n * 16);
    RK_U16 * base_u16 = (RK_U16 *)(base + n * 10);

    pix[0] =  base_u16[0] & 0x03FF;
    pix[1] = (base_u16[0] & 0xFC00) >> 10 | (base_u16[1] & 0x000F) << 6;
    pix[2] = (base_u16[1] & 0x3FF0) >> 4;
    pix[3] = (base_u16[1] & 0xC000) >> 14 | (base_u16[2] & 0x00FF) << 2;
    pix[4] = (base_u16[2] & 0xFF00) >> 8  | (base_u16[3] & 0x0003) << 8;
    pix[5] = (base_u16[3] & 0x0FFC) >> 2;
    pix[6] = (base_u16[3] & 0xF000) >> 12 | (base_u16[4] & 0x003F) << 4;
    pix[7] = (base_u16[4] & 0xFFC0) >> 6;
}